

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O0

int test_cloned_monster(flatcc_builder_t *B)

{
  void *B_00;
  int iVar1;
  flatbuffers_buffer_ref_t fVar2;
  char *pcVar3;
  flatcc_refmap_t *refmap_00;
  MyGame_Example_Monster_table_t t;
  flatcc_refmap_t *refmap_old;
  flatcc_refmap_t refmap;
  size_t sStack_30;
  int ret;
  size_t size;
  void *cloned_buffer;
  void *buffer;
  flatcc_builder_t *B_local;
  
  buffer = B;
  flatcc_refmap_init((flatcc_refmap_t *)&refmap_old);
  gen_monster((flatcc_builder_t *)buffer,0);
  cloned_buffer =
       flatcc_builder_finalize_aligned_buffer((flatcc_builder_t *)buffer,&stack0xffffffffffffffd0);
  hexdump("monster table",cloned_buffer,sStack_30,_stderr);
  refmap.min_table[7]._12_4_ = MyGame_Example_Monster_verify_as_root(cloned_buffer,sStack_30);
  if (refmap.min_table[7]._12_4_ == 0) {
    iVar1 = verify_monster(cloned_buffer);
    if (iVar1 == 0) {
      flatcc_builder_reset((flatcc_builder_t *)buffer);
      refmap_00 = flatcc_builder_set_refmap
                            ((flatcc_builder_t *)buffer,(flatcc_refmap_t *)&refmap_old);
      B_00 = buffer;
      t = MyGame_Example_Monster_as_root(cloned_buffer);
      fVar2 = MyGame_Example_Monster_clone_as_root((flatbuffers_builder_t *)B_00,t);
      if (fVar2 == 0) {
        printf("Cloned Monster didn\'t actually clone.");
        B_local._4_4_ = -1;
      }
      else {
        flatcc_builder_set_refmap((flatcc_builder_t *)buffer,refmap_00);
        size = (size_t)flatcc_builder_finalize_aligned_buffer
                                 ((flatcc_builder_t *)buffer,&stack0xffffffffffffffd0);
        hexdump("cloned monster table",(void *)size,sStack_30,_stderr);
        refmap.min_table[7]._12_4_ = MyGame_Example_Monster_verify_as_root((void *)size,sStack_30);
        if (refmap.min_table[7]._12_4_ == 0) {
          iVar1 = verify_monster((void *)size);
          if (iVar1 == 0) {
            flatcc_refmap_clear((flatcc_refmap_t *)&refmap_old);
            flatcc_builder_aligned_free(cloned_buffer);
            flatcc_builder_aligned_free((void *)size);
            B_local._4_4_ = refmap.min_table[7]._12_4_;
          }
          else {
            printf("Cloned Monster did not have the expected content.");
            B_local._4_4_ = -1;
          }
        }
        else {
          pcVar3 = flatcc_verify_error_string(refmap.min_table[7]._12_4_);
          printf("Cloned Monster buffer failed to verify, got: %s\n",pcVar3);
          B_local._4_4_ = -1;
        }
      }
    }
    else {
      B_local._4_4_ = -1;
    }
  }
  else {
    pcVar3 = flatcc_verify_error_string(refmap.min_table[7]._12_4_);
    printf("Monster buffer failed to verify, got: %s\n",pcVar3);
    B_local._4_4_ = -1;
  }
  return B_local._4_4_;
}

Assistant:

int test_cloned_monster(flatcc_builder_t *B)
{
    void *buffer;
    void *cloned_buffer;
    size_t size;
    int ret;
    flatcc_refmap_t refmap, *refmap_old;

    flatcc_refmap_init(&refmap);
    gen_monster(B, 0);

    buffer = flatcc_builder_finalize_aligned_buffer(B, &size);
    hexdump("monster table", buffer, size, stderr);
    if ((ret = ns(Monster_verify_as_root(buffer, size)))) {
        printf("Monster buffer failed to verify, got: %s\n", flatcc_verify_error_string(ret));
        return -1;
    }
    if (verify_monster(buffer)) {
        return -1;
    }
    flatcc_builder_reset(B);

    /*
     * Clone works without setting a refmap - but then shared references
     * get expanded - and then the verify monster check fails on a DAG
     * test.
     */
    refmap_old = flatcc_builder_set_refmap(B, &refmap);
    if (!ns(Monster_clone_as_root(B, ns(Monster_as_root(buffer))))) {
        printf("Cloned Monster didn't actually clone.");
        return -1;
    };
    /*
     * Restoring old refmap (or zeroing) is optional if we cleared the
     * buffer in this scope, but we don't so we must detach and clean up
     * the refmap manually. refmap_old is likely just null, but this
     * way we do not interfere with caller.
     */
    flatcc_builder_set_refmap(B, refmap_old);
    cloned_buffer = flatcc_builder_finalize_aligned_buffer(B, &size);
    hexdump("cloned monster table", cloned_buffer, size, stderr);
    if ((ret = ns(Monster_verify_as_root(cloned_buffer, size)))) {
        printf("Cloned Monster buffer failed to verify, got: %s\n", flatcc_verify_error_string(ret));
        return -1;
    }
    if (verify_monster(cloned_buffer)) {
        printf("Cloned Monster did not have the expected content.");
        return -1;
    }

    flatcc_refmap_clear(&refmap);
    flatcc_builder_aligned_free(buffer);
    flatcc_builder_aligned_free(cloned_buffer);
    return ret;
}